

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_hoisted_temporaries
          (CompilerGLSL *this,
          SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
          *temporaries)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  pVar4;
  size_t sVar5;
  __node_base_ptr p_Var6;
  long lVar7;
  TypedID<(spirv_cross::Types)0> *pTVar8;
  bool bVar9;
  SPIRType *type;
  mapped_type *name;
  Bitset *pBVar10;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  TypedID<(spirv_cross::Types)0> TVar13;
  __hash_code __code;
  TypedID<(spirv_cross::Types)0> *pTVar14;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar15;
  ulong uVar16;
  uint uVar17;
  __node_base_ptr p_Var18;
  TypedID<(spirv_cross::Types)0> *pTVar19;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *__i;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar20;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar21;
  uint32_t mirror_id;
  string initializer;
  __hashtable *__h;
  __hashtable *__h_1;
  uint32_t local_e4;
  undefined1 local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_58;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_50;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *local_38;
  
  uVar3 = (temporaries->
          super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
          ).buffer_size;
  if (uVar3 != 0) {
    ppVar15 = (temporaries->
              super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
              ).ptr;
    ppVar21 = ppVar15 + uVar3;
    lVar7 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    ::std::
    __introsort_loop<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
              (ppVar15,ppVar21,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)uVar3 < 0x11) {
      ::std::
      __insertion_sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                (ppVar15,ppVar21);
    }
    else {
      ppVar20 = ppVar15 + 0x10;
      ::std::
      __insertion_sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                (ppVar15,ppVar20);
      pTVar19 = &ppVar15[0x10].second;
      do {
        pVar4 = *ppVar20;
        uVar17 = ppVar20[-1].second.id;
        TVar13 = pVar4.second.id;
        ppVar15 = ppVar20;
        pTVar8 = pTVar19;
        if (TVar13.id < uVar17) {
          do {
            pTVar14 = pTVar8;
            uVar1 = pTVar14[-4].id;
            (((pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
               *)(pTVar14 + -1))->first).id = pTVar14[-3].id;
            pTVar14->id = uVar17;
            pTVar8 = pTVar14 + -2;
            uVar17 = uVar1;
          } while (TVar13.id < uVar1);
          ppVar15 = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
                     *)(pTVar14 + -3);
        }
        (ppVar15->first).id = pVar4.first.id.id;
        (ppVar15->second).id = TVar13.id;
        ppVar20 = ppVar20 + 1;
        pTVar19 = pTVar19 + 2;
      } while (ppVar20 != ppVar21);
    }
  }
  sVar5 = (temporaries->
          super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
          ).buffer_size;
  if (sVar5 != 0) {
    ppVar21 = (temporaries->
              super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
              ).ptr;
    local_38 = ppVar21 + sVar5;
    local_40 = &this->local_variable_names;
    local_48 = &this->block_names;
    local_50 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&(this->super_Compiler).ir.meta;
    local_80 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&(this->super_Compiler).hoisted_temporaries;
    local_58 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&(this->super_Compiler).forced_temporaries;
    do {
      type = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        (ppVar21->first).id);
      if ((type->pointer != true) || ((this->backend).native_pointers == true)) {
        local_a0._M_dataplus._M_p._0_4_ = (ppVar21->second).id;
        name = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](local_50,(key_type *)&local_a0);
        add_variable(this,local_40,local_48,(string *)name);
        pBVar10 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)(ppVar21->second).id);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        local_a0._M_string_length = 0;
        local_a0.field_2._M_local_buf[0] = '\0';
        if (((this->options).force_zero_initialized_variables == true) &&
           (bVar9 = type_can_zero_initialize(this,type), bVar9)) {
          (*(this->super_Compiler)._vptr_Compiler[0x37])(&local_c0,this,(ulong)(ppVar21->first).id);
          join<char_const(&)[4],std::__cxx11::string>
                    ((string *)local_e0,(spirv_cross *)0x35ef26,(char (*) [4])&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
          ::std::__cxx11::string::operator=((string *)&local_a0,(string *)local_e0);
          if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)local_e0._0_8_ !=
              (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)(local_e0 + 0x10)) {
            operator_delete((void *)local_e0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_c0._M_dataplus._M_p._4_4_,(uint32_t)local_c0._M_dataplus._M_p) !=
              &local_c0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_c0._M_dataplus._M_p._4_4_,
                                     (uint32_t)local_c0._M_dataplus._M_p));
          }
        }
        flags_to_qualifiers_glsl_abi_cxx11_((string *)local_e0,this,type,pBVar10);
        (*(this->super_Compiler)._vptr_Compiler[6])(local_78,this,(ulong)(ppVar21->second).id,1);
        (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_c0,this,type,local_78,0);
        statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                  (this,(string *)local_e0,&local_c0,&local_a0,(char (*) [2])0x347553);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_c0._M_dataplus._M_p._4_4_,(uint32_t)local_c0._M_dataplus._M_p) !=
            &local_c0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_c0._M_dataplus._M_p._4_4_,
                                   (uint32_t)local_c0._M_dataplus._M_p));
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0]);
        }
        if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)local_e0._0_8_ !=
            (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)(local_e0 + 0x10)) {
          operator_delete((void *)local_e0._0_8_);
        }
        local_c0._M_dataplus._M_p._0_4_ = (ppVar21->second).id;
        local_e0._0_8_ = local_80;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  (local_80,&local_c0,(string *)local_e0);
        local_c0._M_dataplus._M_p._0_4_ = (ppVar21->second).id;
        local_e0._0_8_ = local_58;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  (local_58,&local_c0,(string *)local_e0);
        uVar2 = (ppVar21->second).id;
        (*(this->super_Compiler)._vptr_Compiler[6])
                  ((string *)local_e0,this,(ulong)(ppVar21->second).id,1);
        local_c0._M_dataplus._M_p._0_4_ = CONCAT31(local_c0._M_dataplus._M_p._1_3_,1);
        Compiler::
        set<spirv_cross::SPIRExpression,std::__cxx11::string,spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                  (&this->super_Compiler,uVar2,(string *)local_e0,&ppVar21->first,(bool *)&local_c0)
        ;
        if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)local_e0._0_8_ !=
            (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)(local_e0 + 0x10)) {
          operator_delete((void *)local_e0._0_8_);
        }
        uVar17 = (ppVar21->second).id;
        uVar3 = (this->temporary_to_mirror_precision_alias)._M_h._M_bucket_count;
        uVar16 = (ulong)uVar17 % uVar3;
        p_Var6 = (this->temporary_to_mirror_precision_alias)._M_h._M_buckets[uVar16];
        p_Var11 = (__node_base_ptr)0x0;
        if ((p_Var6 != (__node_base_ptr)0x0) &&
           (p_Var11 = p_Var6, p_Var18 = p_Var6->_M_nxt, uVar17 != *(uint *)&p_Var6->_M_nxt[1]._M_nxt
           )) {
          while (p_Var12 = p_Var18->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
            p_Var11 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var12[1]._M_nxt % uVar3 != uVar16) ||
               (p_Var11 = p_Var18, p_Var18 = p_Var12, uVar17 == *(uint *)&p_Var12[1]._M_nxt))
            goto LAB_00216ecc;
          }
          p_Var11 = (__node_base_ptr)0x0;
        }
LAB_00216ecc:
        if (p_Var11 == (__node_base_ptr)0x0) {
          p_Var12 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var12 = p_Var11->_M_nxt;
        }
        if (p_Var12 != (_Hash_node_base *)0x0) {
          local_e4 = *(uint32_t *)((long)&p_Var12[1]._M_nxt + 4);
          pBVar10 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)local_e4);
          flags_to_qualifiers_glsl_abi_cxx11_((string *)local_e0,this,type,pBVar10);
          (*(this->super_Compiler)._vptr_Compiler[6])(local_78,this,(ulong)local_e4,1);
          (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_c0,this,type,local_78,0);
          statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    (this,(string *)local_e0,&local_c0,&local_a0,(char (*) [2])0x347553);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_c0._M_dataplus._M_p._4_4_,(uint32_t)local_c0._M_dataplus._M_p) !=
              &local_c0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_c0._M_dataplus._M_p._4_4_,
                                     (uint32_t)local_c0._M_dataplus._M_p));
          }
          if (local_78[0] != local_68) {
            operator_delete(local_78[0]);
          }
          if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)local_e0._0_8_ !=
              (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)(local_e0 + 0x10)) {
            operator_delete((void *)local_e0._0_8_);
          }
          uVar2 = local_e4;
          (*(this->super_Compiler)._vptr_Compiler[6])((string *)local_e0,this,(ulong)local_e4,1);
          local_c0._M_dataplus._M_p._0_4_ = CONCAT31(local_c0._M_dataplus._M_p._1_3_,1);
          Compiler::
          set<spirv_cross::SPIRExpression,std::__cxx11::string,spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                    (&this->super_Compiler,uVar2,(string *)local_e0,&ppVar21->first,
                     (bool *)&local_c0);
          if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)local_e0._0_8_ !=
              (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)(local_e0 + 0x10)) {
            operator_delete((void *)local_e0._0_8_);
          }
          local_e0._0_8_ = local_80;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    (local_80,&local_e4,(string *)local_e0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
      ppVar21 = ppVar21 + 1;
    } while (ppVar21 != local_38);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_hoisted_temporaries(SmallVector<pair<TypeID, ID>> &temporaries)
{
	// If we need to force temporaries for certain IDs due to continue blocks, do it before starting loop header.
	// Need to sort these to ensure that reference output is stable.
	sort(begin(temporaries), end(temporaries),
	     [](const pair<TypeID, ID> &a, const pair<TypeID, ID> &b) { return a.second < b.second; });

	for (auto &tmp : temporaries)
	{
		auto &type = get<SPIRType>(tmp.first);

		// There are some rare scenarios where we are asked to declare pointer types as hoisted temporaries.
		// This should be ignored unless we're doing actual variable pointers and backend supports it.
		// Access chains cannot normally be lowered to temporaries in GLSL and HLSL.
		if (type.pointer && !backend.native_pointers)
			continue;

		add_local_variable_name(tmp.second);
		auto &flags = get_decoration_bitset(tmp.second);

		// Not all targets support pointer literals, so don't bother with that case.
		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(tmp.first));

		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(tmp.second)), initializer, ";");

		hoisted_temporaries.insert(tmp.second);
		forced_temporaries.insert(tmp.second);

		// The temporary might be read from before it's assigned, set up the expression now.
		set<SPIRExpression>(tmp.second, to_name(tmp.second), tmp.first, true);

		// If we have hoisted temporaries in multi-precision contexts, emit that here too ...
		// We will not be able to analyze hoisted-ness for dependent temporaries that we hallucinate here.
		auto mirrored_precision_itr = temporary_to_mirror_precision_alias.find(tmp.second);
		if (mirrored_precision_itr != temporary_to_mirror_precision_alias.end())
		{
			uint32_t mirror_id = mirrored_precision_itr->second;
			auto &mirror_flags = get_decoration_bitset(mirror_id);
			statement(flags_to_qualifiers_glsl(type, mirror_flags),
			          variable_decl(type, to_name(mirror_id)),
			          initializer, ";");
			// The temporary might be read from before it's assigned, set up the expression now.
			set<SPIRExpression>(mirror_id, to_name(mirror_id), tmp.first, true);
			hoisted_temporaries.insert(mirror_id);
		}
	}
}